

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O3

double __thiscall cppmetrics::WeightedSnapshot::get_value(WeightedSnapshot *this,double quantile)

{
  double dVar1;
  pointer pEVar2;
  pointer pEVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  pointer pEVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  domain_error *this_00;
  long lVar7;
  difference_type __d;
  ulong uVar8;
  ulong uVar9;
  
  if ((quantile < 0.0) || (1.0 < quantile)) {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this_00,"Quantile must be between 0.0 and 1.0");
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  iVar4 = (*(this->super_Snapshot)._vptr_Snapshot[3])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    return 0.0;
  }
  pEVar2 = (this->m_elements).
           super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->m_elements).
           super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)pEVar3 - (long)pEVar2;
  if (0 < (long)uVar5) {
    pEVar6 = pEVar2;
    uVar5 = (uVar5 >> 3) * -0x5555555555555555;
    do {
      uVar8 = uVar5 >> 1;
      uVar9 = uVar8;
      if (pEVar6[uVar8].quantile <= quantile && quantile != pEVar6[uVar8].quantile) {
        uVar9 = ~uVar8 + uVar5;
        pEVar6 = pEVar6 + uVar8 + 1;
      }
      uVar5 = uVar9;
    } while (0 < (long)uVar9);
    if (pEVar6 != pEVar2) {
      if (pEVar6 == pEVar3) {
        iVar4 = (*(this->super_Snapshot)._vptr_Snapshot[6])(this);
        lVar7 = CONCAT44(extraout_var_01,iVar4);
      }
      else {
        dVar1 = pEVar6->quantile;
        lVar7 = 0;
        if (quantile < dVar1) {
          lVar7 = -0x18;
        }
        if (NAN(dVar1)) {
          lVar7 = -0x18;
        }
        if (dVar1 < quantile) {
          lVar7 = -0x18;
        }
        lVar7 = *(long *)((long)&pEVar6->value + lVar7);
      }
      goto LAB_00118f88;
    }
  }
  iVar4 = (*(this->super_Snapshot)._vptr_Snapshot[4])(this);
  lVar7 = CONCAT44(extraout_var_00,iVar4);
LAB_00118f88:
  return (double)lVar7;
}

Assistant:

double WeightedSnapshot::get_value(double quantile) const
{
  if (quantile < 0 || quantile > 1.0 || std::isnan(quantile))
  {
    throw std::domain_error{"Quantile must be between 0.0 and 1.0"};
  }

  if (size() == 0)
  {
    return 0.0;
  }

  auto lb = std::lower_bound(
    std::begin(m_elements), std::end(m_elements), quantile,
    [](const Element& element, const double& q) { return element.quantile < q; }
  );

  if (lb == std::begin(m_elements))
  {
    // All values are of a greater quantile than requested; just return
    // the least.
    return get_min();
  }

  if (lb == std::end(m_elements))
  {
    // All values have a smaller quantile than requested; return the max.
    return get_max();
  }

  // At this point lb is pointed to the first element *not less than* the request
  // quantile.  Back up one and return its value.
  if (!HasEquivalentOrder(quantile, lb->quantile))
  {
    --lb;
  }

  return lb->value;
}